

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::onEnterDeclareStatementAstNode
          (SemanticAnalyzerRun *this,DeclareStatementAstNode *node)

{
  bool *this_00;
  Scope *this_01;
  element_type *variableName;
  shared_ptr<Token> *token;
  string local_80;
  undefined1 local_60 [8];
  optional<VariableDefinition> originalDeclare;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  allocator<char> local_29;
  
  Scope::findLocally((optional<VariableDefinition> *)local_60,
                     (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&((node->identifier).
                              super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value,
                     false);
  token = &node->identifier;
  if (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"Duplicate identifier found within same scope.",&local_29);
    reportError(this,token,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    this_01 = (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    variableName = (token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = &originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
               super__Optional_payload<VariableDefinition,_true,_false,_false>.
               super__Optional_payload_base<VariableDefinition>._M_engaged;
    std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)this_00,
               &token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>);
    Scope::define(this_01,&variableName->value,(shared_ptr<Token> *)this_00,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  std::_Optional_payload_base<VariableDefinition>::_M_reset
            ((_Optional_payload_base<VariableDefinition> *)local_60);
  return;
}

Assistant:

void onEnterDeclareStatementAstNode(DeclareStatementAstNode* node) noexcept override {
    auto originalDeclare = this->currentScope->findLocally(node->identifier->value, false);
    if (originalDeclare != std::nullopt) {
      this->reportError(node->identifier, "Duplicate identifier found within same scope.");
    } else {
      // paritally define (late bound available) variable for current scope
      this->currentScope->define(node->identifier->value, node->identifier, false);
    }
  }